

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O2

xmlChar * xmlTextReaderReadString(xmlTextReaderPtr reader)

{
  xmlElementType xVar1;
  xmlGenericErrorFunc p_Var2;
  int iVar3;
  xmlChar *pxVar4;
  xmlGenericErrorFunc *pp_Var5;
  void **ppvVar6;
  xmlNodePtr pxVar7;
  
  if ((reader != (xmlTextReaderPtr)0x0) && (reader->node != (xmlNodePtr)0x0)) {
    pxVar7 = reader->node;
    if (reader->curnode != (xmlNodePtr)0x0) {
      pxVar7 = reader->curnode;
    }
    xVar1 = pxVar7->type;
    if (xVar1 == XML_ELEMENT_NODE) {
      iVar3 = xmlTextReaderDoExpand(reader);
      if (iVar3 != -1) {
        pxVar4 = xmlTextReaderCollectSiblings(pxVar7->children);
        return pxVar4;
      }
    }
    else if (xVar1 == XML_ATTRIBUTE_NODE) {
      pp_Var5 = __xmlGenericError();
      p_Var2 = *pp_Var5;
      ppvVar6 = __xmlGenericErrorContext();
      (*p_Var2)(*ppvVar6,"Unimplemented block at %s:%d\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/frida[P]libxml2/xmlreader.c"
                ,0x6d1);
    }
    else if ((xVar1 == XML_TEXT_NODE) && (pxVar7->content != (xmlChar *)0x0)) {
      pxVar4 = xmlStrdup(pxVar7->content);
      return pxVar4;
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlTextReaderReadString(xmlTextReaderPtr reader)
{
    xmlNodePtr node;

    if ((reader == NULL) || (reader->node == NULL))
       return(NULL);

    node = (reader->curnode != NULL) ? reader->curnode : reader->node;
    switch (node->type) {
    case XML_TEXT_NODE:
       if (node->content != NULL)
           return(xmlStrdup(node->content));
       break;
    case XML_ELEMENT_NODE:
	if (xmlTextReaderDoExpand(reader) != -1) {
	    return xmlTextReaderCollectSiblings(node->children);
	}
	break;
    case XML_ATTRIBUTE_NODE:
	TODO
	break;
    default:
       break;
    }
    return(NULL);
}